

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

id gpt_sample_top_k_top_p
             (gpt_vocab *vocab,float *logits,int top_k,double top_p,double temp,mt19937 *rng)

{
  id iVar1;
  result_type_conflict rVar2;
  pointer ppVar3;
  double *pdVar4;
  int iVar5;
  pair<double,_int> *kv_1;
  size_type __new_size;
  pointer ppVar6;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  __i;
  int *piVar7;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  vector<double,_std::allocator<double>_> probs;
  discrete_distribution<int> dist;
  double local_c0;
  _Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_b8;
  double local_a0;
  _Vector_base<double,_std::allocator<double>_> local_98;
  double local_80;
  mt19937 *local_78;
  double local_70;
  ulong local_68;
  param_type local_60;
  
  uVar9 = (vocab->id_to_token)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pair<double,_int> *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pair<double,_int> *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (int)uVar9;
  local_78 = rng;
  local_70 = top_p;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)&local_b8,
             (long)iVar5);
  local_a0 = 1.0;
  uVar10 = 0;
  uVar9 = uVar9 & 0xffffffff;
  if (iVar5 < 1) {
    uVar9 = uVar10;
  }
  for (; ppVar6 = local_b8._M_impl.super__Vector_impl_data._M_finish,
      ppVar3 = local_b8._M_impl.super__Vector_impl_data._M_start, uVar9 != uVar10;
      uVar10 = uVar10 + 1) {
    local_60._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)logits[uVar10] * (1.0 / temp));
    local_60._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = (undefined4)uVar10;
    std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
    emplace_back<std::pair<double,int>>
              ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)&local_b8,
               (pair<double,_int> *)&local_60);
  }
  __new_size = (size_type)top_k;
  lVar11 = __new_size * 0x10;
  local_68 = (ulong)(uint)top_k;
  if (1 < top_k) {
    uVar9 = __new_size - 2 >> 1;
    piVar7 = &local_b8._M_impl.super__Vector_impl_data._M_start[uVar9].second;
    do {
      rng = (mt19937 *)(ulong)(uint)*piVar7;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                (((pair<double,_int> *)(piVar7 + -2))->first,ppVar3,uVar9,__new_size);
      piVar7 = piVar7 + -4;
      bVar13 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar13);
  }
  for (_Var8._M_current = ppVar3 + __new_size; uVar9 = local_68, _Var8._M_current < ppVar6;
      _Var8._M_current = _Var8._M_current + 1) {
    if (ppVar3->first <= (_Var8._M_current)->first && (_Var8._M_current)->first != ppVar3->first) {
      std::
      __pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  )ppVar3,ppVar3 + __new_size,_Var8,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_common_cpp:428:13)>
                  *)rng);
    }
  }
  _Var8._M_current = ppVar3 + __new_size;
  for (; _Var8._M_current = _Var8._M_current + -1, 0x10 < lVar11; lVar11 = lVar11 + -0x10) {
    std::
    __pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
              ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                )ppVar3,_Var8,_Var8,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_common_cpp:428:13)>
                *)rng);
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)&local_b8,
             __new_size);
  local_80 = -INFINITY;
  for (ppVar3 = local_b8._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != local_b8._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    dVar14 = ppVar3->first;
    if (ppVar3->first <= local_80) {
      dVar14 = local_80;
    }
    local_80 = dVar14;
  }
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&local_98,
             (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar3 = local_b8._M_impl.super__Vector_impl_data._M_finish;
  dVar14 = 0.0;
  for (ppVar6 = local_b8._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = local_98._M_impl.super__Vector_impl_data._M_start, ppVar6 != ppVar3;
      ppVar6 = ppVar6 + 1) {
    local_60._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)exp(ppVar6->first - local_80);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_98,
               (value_type_conflict6 *)&local_60);
    dVar14 = dVar14 + (double)local_60._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start;
  }
  for (; pdVar4 != local_98._M_impl.super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    *pdVar4 = *pdVar4 / dVar14;
  }
  if (local_70 < 1.0) {
    uVar12 = 0;
    uVar10 = uVar9 & 0xffffffff;
    if ((int)uVar9 < 1) {
      uVar10 = uVar12;
    }
    local_c0 = 0.0;
    do {
      if (uVar10 == uVar12) goto LAB_0010f0cc;
      local_c0 = local_c0 + local_98._M_impl.super__Vector_impl_data._M_start[uVar12];
      uVar12 = uVar12 + 1;
    } while (local_c0 < local_70);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)&local_98,uVar12);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)&local_b8
               ,uVar12);
LAB_0010f0cc:
    local_a0 = local_a0 / local_c0;
    uVar10 = (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar12 = 0;
    uVar9 = uVar10 & 0xffffffff;
    if ((int)uVar10 < 1) {
      uVar9 = uVar12;
    }
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      local_98._M_impl.super__Vector_impl_data._M_start[uVar12] =
           local_98._M_impl.super__Vector_impl_data._M_start[uVar12] * local_a0;
    }
  }
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_60,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_98._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_98._M_impl.super__Vector_impl_data._M_finish);
  rVar2 = std::discrete_distribution<int>::operator()
                    ((discrete_distribution<int> *)&local_60,local_78);
  iVar1 = local_b8._M_impl.super__Vector_impl_data._M_start[rVar2].second;
  std::discrete_distribution<int>::param_type::~param_type(&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~_Vector_base
            (&local_b8);
  return iVar1;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p(
        const gpt_vocab & vocab,
        const float * logits,
        int    top_k,
        double top_p,
        double temp,
        std::mt19937 & rng) {
    int n_logits = vocab.id_to_token.size();

    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const double scale = 1.0/temp;
        for (int i = 0; i < n_logits; ++i) {
            logits_id.push_back(std::make_pair(logits[i]*scale, i));
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

    //printf("\n");
    //for (int i = 0; i < (int) probs.size(); i++) {
    //    printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
    //}
    //exit(0);

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;
}